

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers(Abc_Ntk_t *pNtk)

{
  int i;
  Abc_Obj_t *pAVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  char *pName;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int i_00;
  
  if (pNtk->vOnehots != (Vec_Ptr_t *)0x0) {
    for (pAVar2 = (Abc_Obj_t *)0x0; (long)pAVar2 < (long)pNtk->vBoxes->nSize;
        pAVar2 = (Abc_Obj_t *)((long)&pAVar2->pNtk + 1)) {
      pAVar1 = Abc_NtkBox(pNtk,(int)pAVar2);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
        pAVar1->pNext = pAVar2;
      }
    }
    p = Vec_PtrAlloc(pNtk->vOnehots->nSize);
    for (iVar3 = 0; iVar3 < pNtk->vOnehots->nSize; iVar3 = iVar3 + 1) {
      p_00 = (Vec_Ptr_t *)Vec_PtrEntry(pNtk->vOnehots,iVar3);
      p_01 = Vec_IntAlloc(p_00->nSize);
      for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
        pName = (char *)Vec_PtrEntry(p_00,i_00);
        i = Nm_ManFindIdByName(pNtk->pManName,pName,5);
        if (-1 < i) {
          pAVar2 = Abc_NtkObj(pNtk,i);
          if (((pAVar2->vFanins).nSize == 1) &&
             ((*(uint *)((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray] + 0x14) & 0xf)
              == 8)) {
            Vec_IntPush(p_01,*(int *)&pAVar2->pNext);
          }
        }
      }
      if (p_01->nSize < 2) {
        Vec_IntFree(p_01);
      }
      else {
        Vec_PtrPush(p,p_01);
        printf("Converted %d one-hot registers.\n",(ulong)(uint)p_01->nSize);
      }
    }
    for (iVar3 = 0; iVar3 < pNtk->vBoxes->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkBox(pNtk,iVar3);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
        pAVar2->pNext = (Abc_Obj_t *)0x0;
      }
    }
    return p;
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vResult, * vNames;
    Vec_Int_t * vNumbers;
    Abc_Obj_t * pObj;
    char * pName;
    int i, k, Num;
    if ( pNtk->vOnehots == NULL )
        return NULL;
    // set register numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // add the numbers
    vResult = Vec_PtrAlloc( Vec_PtrSize(pNtk->vOnehots) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, pNtk->vOnehots, vNames, i )
    {
        vNumbers = Vec_IntAlloc( Vec_PtrSize(vNames) );
        Vec_PtrForEachEntry( char *, vNames, pName, k )
        {
            Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BO );
            if ( Num < 0 )
                continue;
            pObj = Abc_NtkObj( pNtk, Num );
            if ( Abc_ObjFaninNum(pObj) != 1 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
                continue;
            Vec_IntPush( vNumbers, (int)(ABC_PTRINT_T)pObj->pNext );
        }
        if ( Vec_IntSize( vNumbers ) > 1 )
        {
            Vec_PtrPush( vResult, vNumbers );
printf( "Converted %d one-hot registers.\n", Vec_IntSize(vNumbers) );
        }
        else
            Vec_IntFree( vNumbers );
    }
    // clean the numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = NULL;
    return vResult;
}